

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyzer.cpp
# Opt level: O2

void __thiscall
SQCompilation::CheckerVisitor::checkCallFromRoot(CheckerVisitor *this,CallExpr *call)

{
  pointer pSVar1;
  bool bVar2;
  SQChar *str;
  pointer pSVar3;
  
  if (this->effectsOnly == false) {
    str = extractFunctionName(this,call);
    if (str != (SQChar *)0x0) {
      bVar2 = hasAnyEqual(str,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)SQCompilationContext::function_must_be_called_from_root_abi_cxx11_)
      ;
      if (bVar2) {
        pSVar1 = (this->nodeStack).
                 super__Vector_base<SQCompilation::CheckerVisitor::StackSlot,_std::allocator<SQCompilation::CheckerVisitor::StackSlot>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        while (pSVar3 = pSVar1,
              pSVar3 != (this->nodeStack).
                        super__Vector_base<SQCompilation::CheckerVisitor::StackSlot,_std::allocator<SQCompilation::CheckerVisitor::StackSlot>_>
                        ._M_impl.super__Vector_impl_data._M_start) {
          pSVar1 = pSVar3 + -1;
          if ((pSVar3[-1].sst != SST_TABLE_MEMBER) &&
             ((pSVar3[-1].field_1.n)->_op - TO_FUNCTION < 3)) {
            report(this,(Node *)call,0x83,str);
            return;
          }
        }
      }
    }
  }
  return;
}

Assistant:

void CheckerVisitor::checkCallFromRoot(const CallExpr *call) {
  if (effectsOnly)
    return;

  const SQChar *fn = extractFunctionName(call);

  if (!fn)
    return;

  if (!nameLooksLikeMustBeCalledFromRoot(fn)) {
    return;
  }

  bool do_report = false;

  for (auto it = nodeStack.rbegin(); it != nodeStack.rend(); ++it) {
    if (it->sst == SST_TABLE_MEMBER)
      continue;

    enum TreeOp op = it->n->op();

    if (op == TO_FUNCTION || op == TO_CLASS || op == TO_CONSTRUCTOR) {
      do_report = true;
      break;
    }
  }

  if (do_report) {
    report(call, DiagnosticsId::DI_CALL_FROM_ROOT, fn);
  }
}